

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

int iemgui_compatible_colorarg(int index,int argc,t_atom *argv)

{
  int iVar1;
  t_float tVar2;
  int idx;
  int col;
  t_atom *argv_local;
  int argc_local;
  int index_local;
  
  if ((index < 0) || (argc <= index)) {
    argc_local = 0;
  }
  else if (argv[index].a_type == A_FLOAT) {
    tVar2 = atom_getfloatarg(index,argc,argv);
    iVar1 = (int)tVar2;
    if (iVar1 < 0) {
      argc_local = -iVar1 - 1U & 0xffffff;
    }
    else {
      iVar1 = iemgui_modulo_color(iVar1);
      argc_local = iemgui_color_hex[iVar1];
    }
  }
  else {
    argc_local = iemgui_getcolorarg(index,argc,argv);
  }
  return argc_local;
}

Assistant:

int iemgui_compatible_colorarg(int index, int argc, t_atom* argv)
{
    if (index < 0 || index >= argc)
        return 0;
    if(IS_A_FLOAT(argv,index))
        {
            int col=atom_getfloatarg(index, argc, argv);
            if(col >= 0)
            {
                int idx = iemgui_modulo_color(col);
                return(iemgui_color_hex[(idx)]);
            }
            else
               return((-1 -col)&0xffffff);
        }
    return iemgui_getcolorarg(index, argc, argv);
}